

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::renderWithRestart(PrimitiveRestartCase *this)

{
  GLenum GVar1;
  int count;
  PrimitiveRestartCase *this_local;
  
  GVar1 = glwGetError();
  glu::checkError(GVar1,"PrimitiveRestartCase::renderWithRestart() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x23a);
  glwEnable(0x8d69);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"Enable primitive restart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x23d);
  glwClear(0x4500);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"Clear in PrimitiveRestartCase::renderWithRestart()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x23f);
  count = getNumIndices(this);
  draw(this,0,count);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"Draw in PrimitiveRestartCase::renderWithRestart()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x243);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"PrimitiveRestartCase::renderWithRestart() end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x245);
  return;
}

Assistant:

void PrimitiveRestartCase::renderWithRestart (void)
{
	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithRestart() begin");

	glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_CHECK_MSG("Enable primitive restart");
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	GLU_CHECK_MSG("Clear in PrimitiveRestartCase::renderWithRestart()");

	draw(0, getNumIndices());

	GLU_CHECK_MSG("Draw in PrimitiveRestartCase::renderWithRestart()");

	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithRestart() end");
}